

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableRequiresCommand.h
# Opt level: O0

void __thiscall
cmVariableRequiresCommand::~cmVariableRequiresCommand(cmVariableRequiresCommand *this)

{
  cmVariableRequiresCommand *this_local;
  
  ~cmVariableRequiresCommand(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmVariableRequiresCommand; }